

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapNonMessageNonStringField
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  CppType CVar1;
  long *__a;
  long *__b;
  uint *__a_00;
  uint *__b_00;
  unsigned_long *__a_01;
  unsigned_long *__b_01;
  float *__a_02;
  float *__b_02;
  double *__a_03;
  double *__b_03;
  bool *__a_04;
  bool *__b_04;
  int *piVar2;
  int *piVar3;
  LogMessage *pLVar4;
  CppType local_50 [4];
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)r;
  CVar1 = FieldDescriptor::cpp_type(field);
  switch(CVar1) {
  case CPPTYPE_INT32:
    piVar2 = Reflection::MutableRaw<int>((Reflection *)lhs_local,rhs_local,local_28);
    piVar3 = Reflection::MutableRaw<int>((Reflection *)lhs_local,(Message *)field_local,local_28);
    std::swap<int>(piVar2,piVar3);
    break;
  case CPPTYPE_INT64:
    __a = Reflection::MutableRaw<long>((Reflection *)lhs_local,rhs_local,local_28);
    __b = Reflection::MutableRaw<long>((Reflection *)lhs_local,(Message *)field_local,local_28);
    std::swap<long>(__a,__b);
    break;
  case CPPTYPE_UINT32:
    __a_00 = Reflection::MutableRaw<unsigned_int>((Reflection *)lhs_local,rhs_local,local_28);
    __b_00 = Reflection::MutableRaw<unsigned_int>
                       ((Reflection *)lhs_local,(Message *)field_local,local_28);
    std::swap<unsigned_int>(__a_00,__b_00);
    break;
  case CPPTYPE_UINT64:
    __a_01 = Reflection::MutableRaw<unsigned_long>((Reflection *)lhs_local,rhs_local,local_28);
    __b_01 = Reflection::MutableRaw<unsigned_long>
                       ((Reflection *)lhs_local,(Message *)field_local,local_28);
    std::swap<unsigned_long>(__a_01,__b_01);
    break;
  case CPPTYPE_DOUBLE:
    __a_03 = Reflection::MutableRaw<double>((Reflection *)lhs_local,rhs_local,local_28);
    __b_03 = Reflection::MutableRaw<double>((Reflection *)lhs_local,(Message *)field_local,local_28)
    ;
    std::swap<double>(__a_03,__b_03);
    break;
  case CPPTYPE_FLOAT:
    __a_02 = Reflection::MutableRaw<float>((Reflection *)lhs_local,rhs_local,local_28);
    __b_02 = Reflection::MutableRaw<float>((Reflection *)lhs_local,(Message *)field_local,local_28);
    std::swap<float>(__a_02,__b_02);
    break;
  case CPPTYPE_BOOL:
    __a_04 = Reflection::MutableRaw<bool>((Reflection *)lhs_local,rhs_local,local_28);
    __b_04 = Reflection::MutableRaw<bool>((Reflection *)lhs_local,(Message *)field_local,local_28);
    std::swap<bool>(__a_04,__b_04);
    break;
  case CPPTYPE_ENUM:
    piVar2 = Reflection::MutableRaw<int>((Reflection *)lhs_local,rhs_local,local_28);
    piVar3 = Reflection::MutableRaw<int>((Reflection *)lhs_local,(Message *)field_local,local_28);
    std::swap<int>(piVar2,piVar3);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x370);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [21])"Unimplemented type: ");
    local_50[0] = FieldDescriptor::cpp_type(local_28);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::
             operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
                       (pLVar4,local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapNonMessageNonStringField(
    const Reflection* r, Message* lhs, Message* rhs,
    const FieldDescriptor* field) {
  switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)               \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:       \
    std::swap(*r->MutableRaw<TYPE>(lhs, field),  \
              *r->MutableRaw<TYPE>(rhs, field)); \
    break;

    SWAP_VALUES(INT32, int32_t);
    SWAP_VALUES(INT64, int64_t);
    SWAP_VALUES(UINT32, uint32_t);
    SWAP_VALUES(UINT64, uint64_t);
    SWAP_VALUES(FLOAT, float);
    SWAP_VALUES(DOUBLE, double);
    SWAP_VALUES(BOOL, bool);
    SWAP_VALUES(ENUM, int);
#undef SWAP_VALUES
    default:
      ABSL_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
  }
}